

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_int(FuncState *fs,int reg,lua_Integer i)

{
  int iVar1;
  lua_Integer i_local;
  int reg_local;
  FuncState *fs_local;
  
  iVar1 = fitsBx(i);
  if (iVar1 == 0) {
    iVar1 = luaK_intK(fs,i);
    luaK_codek(fs,reg,iVar1);
  }
  else {
    codeAsBx(fs,OP_LOADI,reg,(int)i);
  }
  return;
}

Assistant:

void luaK_int (FuncState *fs, int reg, lua_Integer i) {
  if (fitsBx(i))
    codeAsBx(fs, OP_LOADI, reg, cast_int(i));
  else
    luaK_codek(fs, reg, luaK_intK(fs, i));
}